

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON_SubDFace * __thiscall
ON_SubD_FixedSizeHeap::AllocateQuad
          (ON_SubD_FixedSizeHeap *this,uint zero_face_id,uint parent_face_id,ON_SubDEdgePtr *eptrs)

{
  ushort uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  ON_SubDFace *face;
  ON_SubDFacePtr OVar6;
  ulong uVar7;
  ON_SubDComponentBase *this_00;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  if (eptrs != (ON_SubDEdgePtr *)0x0) {
    this_00 = (ON_SubDComponentBase *)(eptrs->m_ptr & 0xfffffffffffffff8);
    if ((this_00 != (ON_SubDComponentBase *)0x0) && ((ushort)this_00[1].m_group_id < 2)) {
      uVar12 = eptrs[1].m_ptr & 0xfffffffffffffff8;
      if ((uVar12 != 0) && (*(ushort *)(uVar12 + 100) < 2)) {
        uVar9 = eptrs[2].m_ptr & 0xfffffffffffffff8;
        if ((uVar9 != 0) && (*(ushort *)(uVar9 + 100) < 2)) {
          uVar7 = eptrs[3].m_ptr & 0xfffffffffffffff8;
          if ((uVar7 != 0) && (*(ushort *)(uVar7 + 100) < 2)) {
            uVar8 = (uint)eptrs->m_ptr & 1;
            dVar2 = this_00[1].m_saved_subd_point1[(ulong)uVar8 + 3];
            if ((((dVar2 != 0.0) && (*(long *)((long)dVar2 + 0x78) != 0)) &&
                (*(ushort *)((long)dVar2 + 0x6a) < *(ushort *)((long)dVar2 + 0x6e))) &&
               (uVar10 = (uint)eptrs[3].m_ptr & 1,
               dVar2 == *(double *)(uVar7 + 0x80 + (ulong)(uVar10 ^ 1) * 8))) {
              uVar13 = (uint)eptrs[1].m_ptr & 1;
              dVar3 = *(double *)(uVar12 + 0x80 + (ulong)uVar13 * 8);
              if (((dVar3 != 0.0) && (*(long *)((long)dVar3 + 0x78) != 0)) &&
                 ((*(ushort *)((long)dVar3 + 0x6a) < *(ushort *)((long)dVar3 + 0x6e) &&
                  (dVar3 == this_00[1].m_saved_subd_point1[(ulong)(uVar8 ^ 1) + 3])))) {
                uVar11 = (uint)eptrs[2].m_ptr & 1;
                lVar4 = *(long *)(uVar9 + 0x80 + (ulong)uVar11 * 8);
                if (((((lVar4 != 0) && (*(long *)(lVar4 + 0x78) != 0)) &&
                     (*(ushort *)(lVar4 + 0x6a) < *(ushort *)(lVar4 + 0x6e))) &&
                    ((((lVar4 == *(long *)(uVar12 + 0x80 + (ulong)(uVar13 ^ 1) * 8) &&
                       (lVar5 = *(long *)(uVar7 + 0x80 + (ulong)uVar10 * 8), lVar5 != 0)) &&
                      (*(long *)(lVar5 + 0x78) != 0)) &&
                     ((*(ushort *)(lVar5 + 0x6a) < *(ushort *)(lVar5 + 0x6e) &&
                      (lVar5 == *(long *)(uVar9 + 0x80 + (ulong)(uVar11 ^ 1) * 8))))))) &&
                   (face = Internal_AllocateFace(this,zero_face_id,parent_face_id),
                   face != (ON_SubDFace *)0x0)) {
                  face->m_edge_count = 4;
                  face->m_edge4[0].m_ptr = eptrs->m_ptr;
                  face->m_edge4[1].m_ptr = eptrs[1].m_ptr;
                  face->m_edge4[2].m_ptr = eptrs[2].m_ptr;
                  face->m_edge4[3].m_ptr = eptrs[3].m_ptr;
                  OVar6 = ON_SubDFacePtr::Create(face,(ulong)uVar8);
                  uVar1 = (ushort)this_00[1].m_group_id;
                  *(ushort *)&this_00[1].m_group_id = uVar1 + 1;
                  this_00[1].m_saved_subd_point1[uVar1] = (double)OVar6.m_ptr;
                  OVar6 = ON_SubDFacePtr::Create(face,(ulong)uVar13);
                  uVar1 = *(ushort *)(uVar12 + 100);
                  *(ushort *)(uVar12 + 100) = uVar1 + 1;
                  *(ON__UINT_PTR *)(uVar12 + 0x68 + (ulong)uVar1 * 8) = OVar6.m_ptr;
                  OVar6 = ON_SubDFacePtr::Create(face,(ulong)uVar11);
                  uVar1 = *(ushort *)(uVar9 + 100);
                  *(ushort *)(uVar9 + 100) = uVar1 + 1;
                  *(ON__UINT_PTR *)(uVar9 + 0x68 + (ulong)uVar1 * 8) = OVar6.m_ptr;
                  OVar6 = ON_SubDFacePtr::Create(face,(ulong)uVar10);
                  uVar1 = *(ushort *)(uVar7 + 100);
                  *(ushort *)(uVar7 + 100) = uVar1 + 1;
                  *(ON__UINT_PTR *)(uVar7 + 0x68 + (ulong)uVar1 * 8) = OVar6.m_ptr;
                  uVar1 = *(ushort *)((long)dVar2 + 0x6a);
                  *(ushort *)((long)dVar2 + 0x6a) = uVar1 + 1;
                  *(ON_SubDFace **)(*(long *)((long)dVar2 + 0x78) + (ulong)uVar1 * 8) = face;
                  uVar1 = *(ushort *)((long)dVar3 + 0x6a);
                  *(ushort *)((long)dVar3 + 0x6a) = uVar1 + 1;
                  *(ON_SubDFace **)(*(long *)((long)dVar3 + 0x78) + (ulong)uVar1 * 8) = face;
                  uVar1 = *(ushort *)(lVar4 + 0x6a);
                  *(ushort *)(lVar4 + 0x6a) = uVar1 + 1;
                  *(ON_SubDFace **)(*(long *)(lVar4 + 0x78) + (ulong)uVar1 * 8) = face;
                  uVar1 = *(ushort *)(lVar5 + 0x6a);
                  *(ushort *)(lVar5 + 0x6a) = uVar1 + 1;
                  *(ON_SubDFace **)(*(long *)(lVar5 + 0x78) + (ulong)uVar1 * 8) = face;
                  uVar8 = ON_SubDComponentBase::SubdivisionLevel(this_00);
                  ON_SubDComponentBase::SetSubdivisionLevel(&face->super_ON_SubDComponentBase,uVar8)
                  ;
                  return face;
                }
              }
            }
          }
        }
      }
    }
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDFace *)0x0;
}

Assistant:

ON_SubDFace* ON_SubD_FixedSizeHeap::AllocateQuad(
  unsigned int zero_face_id,
  unsigned int parent_face_id,
  const ON_SubDEdgePtr eptrs[4]
  )
{
  if (nullptr == eptrs)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDEdge* edges[4] = {
    ON_SUBD_EDGE_POINTER(eptrs[0].m_ptr),
    ON_SUBD_EDGE_POINTER(eptrs[1].m_ptr),
    ON_SUBD_EDGE_POINTER(eptrs[2].m_ptr),
    ON_SUBD_EDGE_POINTER(eptrs[3].m_ptr)};

  if (nullptr == edges[0] || edges[0]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == edges[1] || edges[1]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == edges[2] || edges[2]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == edges[3] || edges[3]->m_face_count > 1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON__UINT_PTR edgedirs[4] = {
    ON_SUBD_EDGE_DIRECTION(eptrs[0].m_ptr),
    ON_SUBD_EDGE_DIRECTION(eptrs[1].m_ptr),
    ON_SUBD_EDGE_DIRECTION(eptrs[2].m_ptr),
    ON_SUBD_EDGE_DIRECTION(eptrs[3].m_ptr)};

  ON_SubDVertex* vertices[4] = {
    const_cast<ON_SubDVertex*>(edges[0]->m_vertex[edgedirs[0]]),
    const_cast<ON_SubDVertex*>(edges[1]->m_vertex[edgedirs[1]]),
    const_cast<ON_SubDVertex*>(edges[2]->m_vertex[edgedirs[2]]),
    const_cast<ON_SubDVertex*>(edges[3]->m_vertex[edgedirs[3]]) };

  if (nullptr == vertices[0] || nullptr == vertices[0]->m_faces || vertices[0]->m_face_count >= vertices[0]->m_face_capacity || vertices[0] != edges[3]->m_vertex[1-edgedirs[3]])
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == vertices[1] || nullptr == vertices[1]->m_faces || vertices[1]->m_face_count >= vertices[1]->m_face_capacity || vertices[1] != edges[0]->m_vertex[1-edgedirs[0]])
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == vertices[2] || nullptr == vertices[2]->m_faces || vertices[2]->m_face_count >= vertices[2]->m_face_capacity || vertices[2] != edges[1]->m_vertex[1-edgedirs[1]])
    return ON_SUBD_RETURN_ERROR(nullptr);
  if (nullptr == vertices[3] || nullptr == vertices[3]->m_faces || vertices[3]->m_face_count >= vertices[3]->m_face_capacity || vertices[3] != edges[2]->m_vertex[1-edgedirs[2]])
    return ON_SUBD_RETURN_ERROR(nullptr);

  ON_SubDFace* f = Internal_AllocateFace(zero_face_id,parent_face_id);
  if (nullptr == f)
    return ON_SUBD_RETURN_ERROR(nullptr);

  f->m_edge_count = 4;
  f->m_edge4[0] = eptrs[0];
  f->m_edge4[1] = eptrs[1];
  f->m_edge4[2] = eptrs[2];
  f->m_edge4[3] = eptrs[3];

  edges[0]->m_face2[edges[0]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[0]);
  edges[1]->m_face2[edges[1]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[1]);
  edges[2]->m_face2[edges[2]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[2]);
  edges[3]->m_face2[edges[3]->m_face_count++] = ON_SubDFacePtr::Create(f,edgedirs[3]);

  vertices[0]->m_faces[vertices[0]->m_face_count++] = f;
  //vertices[0]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
  vertices[1]->m_faces[vertices[1]->m_face_count++] = f;
  //vertices[1]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
  vertices[2]->m_faces[vertices[2]->m_face_count++] = f;
  //vertices[2]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;
  vertices[3]->m_faces[vertices[3]->m_face_count++] = f;
  //vertices[3]->m_vertex_edge_order = ON_SubD::VertexEdgeOrder::unset;

  f->SetSubdivisionLevel( edges[0]->SubdivisionLevel() );

  return f;
}